

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_access_ptr(Integer g_a,Integer *lo,Integer *hi,void *ptr,Integer *ld)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  logical lVar7;
  size_t sVar8;
  long lVar9;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  long lVar10;
  undefined8 *in_RSI;
  long in_RDI;
  long *in_R8;
  char err_string_1 [256];
  Integer _d_4;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_3;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_2;
  Integer _nb;
  Integer _loc;
  Integer _p_handle;
  Integer _pinv;
  Integer _hi [7];
  Integer _lo [7];
  Integer _last;
  Integer _factor;
  Integer _w;
  Integer _d_1;
  Integer _offset;
  char err_string [256];
  char *str;
  int _l;
  int _d;
  Integer p_handle;
  Integer i;
  Integer ow;
  Integer handle;
  char *lptr;
  char local_408 [256];
  ulong local_308;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  int local_2e8 [7];
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  int local_2b8 [10];
  int local_290;
  int local_28c;
  long local_288;
  long local_280;
  long in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  long local_268;
  long local_260;
  long local_248;
  char *local_238;
  long local_230;
  long local_228;
  char *local_210;
  long local_208 [8];
  long local_1c8 [7];
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  char local_168 [128];
  Integer *in_stack_ffffffffffffff18;
  Integer *in_stack_ffffffffffffff20;
  Integer in_stack_ffffffffffffff28;
  int local_58;
  int local_54;
  long local_48;
  char *local_40;
  
  lVar5 = in_RDI + 1000;
  lVar6 = (long)GA[lVar5].p_handle;
  lVar7 = pnga_locate(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18)
  ;
  if (lVar7 == 0) {
    pnga_error(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  }
  if (lVar6 != -1) {
    local_40 = (char *)(long)PGRP_LIST[lVar6].inv_map_proc_list[(long)local_40];
  }
  iVar3 = armci_domain_id(0,(int)local_40);
  iVar4 = armci_domain_my_id(0);
  if ((iVar3 != iVar4) && (local_40 != (char *)GAme)) {
    pnga_error(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  }
  lVar7 = pnga_locate(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18)
  ;
  if (lVar7 == 0) {
    pnga_error(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  }
  if (lVar6 != -1) {
    local_40 = (char *)(long)PGRP_LIST[lVar6].inv_map_proc_list[(long)local_40];
  }
  iVar3 = armci_domain_id(0,(int)local_40);
  iVar4 = armci_domain_my_id(0);
  if ((iVar3 != iVar4) && (local_40 != (char *)GAme)) {
    pnga_error(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  }
  for (local_48 = 0; local_48 < GA[lVar5].ndim; local_48 = local_48 + 1) {
    if ((long)in_RDX[local_48] < (long)in_RSI[local_48]) {
      sprintf(local_168,"%s","cannot locate region: ");
      sVar8 = strlen("cannot locate region: ");
      sprintf(local_168 + (int)sVar8,"%s",GA[in_RDI + 1000].name);
      sVar8 = strlen(local_168);
      sprintf(local_168 + (int)sVar8," [%ld:%ld ",*in_RSI,*in_RDX);
      sVar8 = strlen(local_168);
      local_58 = (int)sVar8;
      for (local_54 = 1; local_54 < GA[lVar5].ndim; local_54 = local_54 + 1) {
        sprintf(local_168 + local_58,",%ld:%ld ",in_RSI[local_54],in_RDX[local_54]);
        sVar8 = strlen(local_168);
        local_58 = (int)sVar8;
      }
      sprintf(local_168 + local_58,"%s","]");
      strlen(local_168);
      pnga_error(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    }
  }
  if (-1 < lVar6) {
    local_40 = (char *)(long)PGRP_LIST[lVar6].map_proc_list[(long)local_40];
  }
  if (0 < GA[lVar5].num_rstrctd) {
    local_40 = (char *)GA[lVar5].rank_rstrctd[(long)local_40];
  }
  local_170 = 0;
  local_188 = 1;
  local_190 = (long)(GA[lVar5].ndim + -1);
  if (GA[lVar5].distr_type == 0) {
    if (GA[lVar5].num_rstrctd == 0) {
      lVar6 = (long)GA[lVar5].ndim;
      local_248 = 0;
      local_228 = 1;
      for (local_230 = 0; local_230 < lVar6; local_230 = local_230 + 1) {
        local_228 = GA[lVar5].nblock[local_230] * local_228;
      }
      if ((local_228 + -1 < (long)local_40) || ((long)local_40 < 0)) {
        for (local_230 = 0; local_230 < lVar6; local_230 = local_230 + 1) {
          local_1c8[local_230] = 0;
          local_208[local_230] = -1;
        }
      }
      else {
        local_238 = local_40;
        for (local_230 = 0; local_230 < lVar6; local_230 = local_230 + 1) {
          lVar10 = (long)local_238 % (long)GA[lVar5].nblock[local_230];
          local_238 = (char *)((long)local_238 / (long)GA[lVar5].nblock[local_230]);
          lVar9 = lVar10 + local_248;
          local_248 = GA[lVar5].nblock[local_230] + local_248;
          local_1c8[local_230] = GA[lVar5].mapc[lVar9];
          if (lVar10 == GA[lVar5].nblock[local_230] + -1) {
            local_208[local_230] = GA[lVar5].dims[local_230];
          }
          else {
            local_208[local_230] = GA[lVar5].mapc[lVar9 + 1] + -1;
          }
        }
      }
    }
    else if ((long)local_40 < GA[lVar5].num_rstrctd) {
      in_stack_fffffffffffffd88 = (long)GA[lVar5].ndim;
      local_280 = 0;
      local_260 = 1;
      for (local_268 = 0; local_268 < in_stack_fffffffffffffd88; local_268 = local_268 + 1) {
        local_260 = GA[lVar5].nblock[local_268] * local_260;
      }
      if ((local_260 + -1 < (long)local_40) || ((long)local_40 < 0)) {
        for (local_268 = 0; local_268 < in_stack_fffffffffffffd88; local_268 = local_268 + 1) {
          local_1c8[local_268] = 0;
          local_208[local_268] = -1;
        }
      }
      else {
        in_stack_fffffffffffffd90 = local_40;
        for (local_268 = 0; local_268 < in_stack_fffffffffffffd88; local_268 = local_268 + 1) {
          lVar6 = (long)in_stack_fffffffffffffd90 % (long)GA[lVar5].nblock[local_268];
          in_stack_fffffffffffffd90 =
               (char *)((long)in_stack_fffffffffffffd90 / (long)GA[lVar5].nblock[local_268]);
          local_288 = lVar6 + local_280;
          local_280 = GA[lVar5].nblock[local_268] + local_280;
          local_1c8[local_268] = GA[lVar5].mapc[local_288];
          if (lVar6 == GA[lVar5].nblock[local_268] + -1) {
            local_208[local_268] = GA[lVar5].dims[local_268];
          }
          else {
            local_208[local_268] = GA[lVar5].mapc[local_288 + 1] + -1;
          }
        }
      }
    }
    else {
      sVar1 = GA[lVar5].ndim;
      local_290 = (int)sVar1;
      for (local_28c = 0; local_28c < sVar1; local_28c = local_28c + 1) {
        local_1c8[local_28c] = 0;
        local_208[local_28c] = -1;
      }
    }
  }
  else {
    iVar3 = (int)local_40;
    if (((GA[lVar5].distr_type == 1) || (GA[lVar5].distr_type == 2)) || (GA[lVar5].distr_type == 3))
    {
      sVar1 = GA[lVar5].ndim;
      local_2c0 = (int)sVar1;
      sVar2 = GA[lVar5].ndim;
      local_2cc = (int)sVar2;
      local_2c4 = iVar3;
      local_2b8[0] = (int)((long)iVar3 % GA[lVar5].num_blocks[0]);
      for (local_2c8 = 1; local_2c8 < sVar2; local_2c8 = local_2c8 + 1) {
        local_2c4 = (int)((long)(local_2c4 - local_2b8[local_2c8 + -1]) /
                         GA[lVar5].num_blocks[local_2c8 + -1]);
        local_2b8[local_2c8] = (int)((long)local_2c4 % GA[lVar5].num_blocks[local_2c8]);
      }
      for (local_2bc = 0; local_2bc < sVar1; local_2bc = local_2bc + 1) {
        local_1c8[local_2bc] = (long)local_2b8[local_2bc] * GA[lVar5].block_dims[local_2bc] + 1;
        local_208[local_2bc] = (long)(local_2b8[local_2bc] + 1) * GA[lVar5].block_dims[local_2bc];
        if (GA[lVar5].dims[local_2bc] < local_208[local_2bc]) {
          local_208[local_2bc] = GA[lVar5].dims[local_2bc];
        }
      }
    }
    else if (GA[lVar5].distr_type == 4) {
      local_2f0 = (int)GA[lVar5].ndim;
      local_2f4 = 0;
      local_300 = (int)GA[lVar5].ndim;
      local_2e8[0] = (int)((long)iVar3 % GA[lVar5].num_blocks[0]);
      local_2f8 = iVar3;
      for (local_2fc = 1; local_2fc < local_300; local_2fc = local_2fc + 1) {
        local_2f8 = (int)((long)(local_2f8 - local_2e8[local_2fc + -1]) /
                         GA[lVar5].num_blocks[local_2fc + -1]);
        local_2e8[local_2fc] = (int)((long)local_2f8 % GA[lVar5].num_blocks[local_2fc]);
      }
      for (local_2ec = 0; local_2ec < local_2f0; local_2ec = local_2ec + 1) {
        local_1c8[local_2ec] = GA[lVar5].mapc[local_2f4 + local_2e8[local_2ec]];
        if ((long)local_2e8[local_2ec] < GA[lVar5].num_blocks[local_2ec] + -1) {
          local_208[local_2ec] = GA[lVar5].mapc[local_2f4 + local_2e8[local_2ec] + 1] + -1;
        }
        else {
          local_208[local_2ec] = GA[lVar5].dims[local_2ec];
        }
        local_2f4 = local_2f4 + (int)GA[lVar5].num_blocks[local_2ec];
      }
    }
  }
  for (local_308 = 0; (long)local_308 < (long)GA[lVar5].ndim; local_308 = local_308 + 1) {
    if (((long)in_RSI[local_308] < local_1c8[local_308]) ||
       (local_208[local_308] < (long)in_RSI[local_308])) {
      sprintf(local_408,"check subscript failed:%ld not in (%ld:%ld) dim=%d",in_RSI[local_308],
              local_1c8[local_308],local_208[local_308],local_308 & 0xffffffff);
      pnga_error(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    }
  }
  if (local_190 == 0) {
    *in_R8 = (local_208[0] - local_1c8[0]) + 1 + GA[lVar5].width[0] * 2;
  }
  for (local_178 = 0; local_178 < local_190; local_178 = local_178 + 1) {
    local_180 = GA[lVar5].width[local_178];
    local_170 = ((in_RSI[local_178] - local_1c8[local_178]) + local_180) * local_188 + local_170;
    in_R8[local_178] = (local_208[local_178] - local_1c8[local_178]) + 1 + local_180 * 2;
    local_188 = in_R8[local_178] * local_188;
  }
  if (GA[lVar5].p_handle == 0) {
    local_210 = (char *)(long)PGRP_LIST->inv_map_proc_list[(long)local_40];
  }
  else if (GA[lVar5].num_rstrctd == 0) {
    local_210 = local_40;
  }
  else {
    local_210 = (char *)GA[lVar5].rstrctd_list[(long)local_40];
  }
  *in_RCX = GA[lVar5].ptr[(long)local_210] +
            (((in_RSI[local_190] - local_1c8[local_190]) + GA[lVar5].width[local_190]) * local_188 +
            local_170) * (long)GA[lVar5].elemsize;
  return;
}

Assistant:

void pnga_access_ptr(Integer g_a, Integer lo[], Integer hi[],
                      void* ptr, Integer ld[])
{
char *lptr;
Integer  handle = GA_OFFSET + g_a;
Integer  ow,i,p_handle;

   
   p_handle = GA[handle].p_handle;
   if (!pnga_locate(g_a,lo,&ow)) pnga_error("locate top failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme)) 
      pnga_error("cannot access top of the patch",ow);
   if (!pnga_locate(g_a,hi, &ow)) pnga_error("locate bottom failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme))
      pnga_error("cannot access bottom of the patch",ow);

   for (i=0; i<GA[handle].ndim; i++)
       if(lo[i]>hi[i]) {
           ga_RegionError(GA[handle].ndim, lo, hi, g_a);
       }

   if (p_handle >= 0) {
     ow = PGRP_LIST[p_handle].map_proc_list[ow];
   }
   if (GA[handle].num_rstrctd > 0) {
     ow = GA[handle].rank_rstrctd[ow];
   }
   gam_Location(ow,handle, lo, &lptr, ld);
   *(char**)ptr = lptr; 
}